

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblecache.cpp
# Opt level: O0

Id __thiscall QAccessibleCache::idForObject(QAccessibleCache *this,QObject *obj)

{
  bool bVar1;
  QMetaObject *pQVar2;
  iterator o;
  pair<unsigned_int,_const_QMetaObject_*> *ppVar3;
  undefined8 *in_RSI;
  QList<std::pair<unsigned_int,_const_QMetaObject_*>_> *in_RDI;
  long in_FS_OFFSET;
  QList<std::pair<unsigned_int,_const_QMetaObject_*>_> *__range2;
  QMetaObject *mo;
  pair<unsigned_int,_const_QMetaObject_*> pair;
  iterator __end2;
  iterator __begin2;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar4;
  Id local_54;
  Id local_50;
  iterator local_30 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (undefined8 *)0x0) {
    pQVar2 = (QMetaObject *)(**(code **)*in_RSI)();
    QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>::values
              ((QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),(QObject **)in_RDI);
    local_30[0].i = (pair<unsigned_int,_const_QMetaObject_*> *)&DAT_aaaaaaaaaaaaaaaa;
    local_30[0] = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::begin(in_RDI);
    o = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::end(in_RDI);
    while (bVar1 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::iterator::operator!=
                             (local_30,o), bVar1) {
      ppVar3 = QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::iterator::operator*(local_30);
      if (ppVar3->second == pQVar2) {
        local_50 = (Id)*(undefined8 *)ppVar3;
        local_54 = local_50;
        iVar4 = 1;
        goto LAB_009672eb;
      }
      QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::iterator::operator++(local_30);
    }
    iVar4 = 2;
LAB_009672eb:
    QList<std::pair<unsigned_int,_const_QMetaObject_*>_>::~QList
              ((QList<std::pair<unsigned_int,_const_QMetaObject_*>_> *)0x9672f5);
    if (iVar4 == 1) goto LAB_0096730a;
  }
  local_54 = 0;
LAB_0096730a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_54;
}

Assistant:

QAccessible::Id QAccessibleCache::idForObject(QObject *obj) const
{
    if (obj) {
        const QMetaObject *mo = obj->metaObject();
        for (auto pair : objectToId.values(obj)) {
            if (pair.second == mo) {
                return pair.first;
            }
        }
    }
    return 0;
}